

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

_Bool art_internal_validate(art_t *art,char **reason,art_validate_cb_t validate_cb)

{
  art_internal_validate_t validator;
  long lVar1;
  _Bool _Var2;
  char **ppcVar3;
  char *reason_local;
  uint6 uStack_e;
  char *local_8;
  
  ppcVar3 = &local_8;
  if (reason != (char **)0x0) {
    ppcVar3 = reason;
  }
  *ppcVar3 = (char *)0x0;
  if (art->root == (art_node_t *)0x0) {
    _Var2 = true;
  }
  else {
    lVar1 = (ulong)uStack_e << 0x10;
    validator.validate_cb = validate_cb;
    validator.reason = ppcVar3;
    validator.depth = 0;
    validator.current_key[0] = '\0';
    validator.current_key[1] = '\0';
    validator.current_key[2] = '\0';
    validator.current_key[3] = '\0';
    validator.current_key[4] = (char)lVar1;
    validator.current_key[5] = (char)((ulong)lVar1 >> 8);
    validator._26_6_ = (int6)((ulong)lVar1 >> 0x10);
    _Var2 = art_internal_validate_at(art->root,validator);
  }
  return _Var2;
}

Assistant:

bool art_internal_validate(const art_t *art, const char **reason,
                           art_validate_cb_t validate_cb) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    if (art->root == NULL) {
        return true;
    }
    art_internal_validate_t validator = {
        .reason = reason,
        .validate_cb = validate_cb,
        .depth = 0,
        .current_key = {0},
    };
    return art_internal_validate_at(art->root, validator);
}